

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# regr_sxy.cpp
# Opt level: O2

AggregateFunction * duckdb::RegrSXYFun::GetFunction(void)

{
  AggregateFunction *in_RDI;
  LogicalType *in_R8;
  LogicalType aLStack_58 [24];
  LogicalType local_40 [24];
  
  duckdb::LogicalType::LogicalType((LogicalType *)&stack0xffffffffffffffd8,DOUBLE);
  duckdb::LogicalType::LogicalType(local_40,DOUBLE);
  duckdb::LogicalType::LogicalType(aLStack_58,DOUBLE);
  AggregateFunction::
  BinaryAggregate<duckdb::RegrSXyState,double,double,double,duckdb::RegrSXYOperation,(duckdb::AggregateDestructorType)0>
            (in_RDI,(AggregateFunction *)&stack0xffffffffffffffd8,local_40,aLStack_58,in_R8);
  duckdb::LogicalType::~LogicalType(aLStack_58);
  duckdb::LogicalType::~LogicalType(local_40);
  duckdb::LogicalType::~LogicalType((LogicalType *)&stack0xffffffffffffffd8);
  return in_RDI;
}

Assistant:

AggregateFunction RegrSXYFun::GetFunction() {
	return AggregateFunction::BinaryAggregate<RegrSXyState, double, double, double, RegrSXYOperation>(
	    LogicalType::DOUBLE, LogicalType::DOUBLE, LogicalType::DOUBLE);
}